

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_Typeof(SyntaxDumper *this,ExtGNU_TypeofSyntax *node)

{
  TypeReferenceSyntax *pTVar1;
  SyntaxToken local_50;
  ExtGNU_TypeofSyntax *local_18;
  ExtGNU_TypeofSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ExtGNU_TypeofSyntax *)this;
  ExtGNU_TypeofSyntax::typeofKeyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  pTVar1 = ExtGNU_TypeofSyntax::tyReference(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pTVar1);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_Typeof(const ExtGNU_TypeofSyntax* node) override
    {
        terminal(node->typeofKeyword(), node);
        nonterminal(node->tyReference());
        return Action::Skip;
    }